

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_blend.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool *this;
  char *__s;
  int iVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  long *plVar5;
  int iVar6;
  undefined1 local_178 [8];
  BlendBenchWindow surface;
  SDLBackend backend;
  
  if (0 < argc) {
    iVar2 = 0;
    do {
      std::__cxx11::string::string
                ((string *)local_178,argv[iVar2],
                 (allocator *)
                 &surface.m_pendingJobs.
                  super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
                  ._M_impl._M_node._M_size);
      iVar6 = iVar2 + 1;
      if ((iVar6 < argc) && (iVar1 = std::__cxx11::string::compare((char *)local_178), iVar1 == 0))
      {
        nodeCount = atoi(argv[iVar6]);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)local_178);
        iVar6 = iVar2;
        if (iVar1 == 0) {
          useTextures = 1;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)local_178);
          if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)local_178), iVar2 == 0)
             ) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
            std::ostream::put(-0x50);
            poVar3 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," > ",3);
            __s = *argv;
            if (__s == (char *)0x0) {
              std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
            }
            else {
              sVar4 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," [options]",10);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            plVar5 = (long *)std::ostream::flush();
            std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
            std::ostream::put((char)plVar5);
            poVar3 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Options:",8);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            poVar3 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar3,"  --count [x]      Number of layers",0x23);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            poVar3 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar3,"  --textures       Use textures rather than solid fills",0x37);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
          }
        }
      }
      if (local_178 != (undefined1  [8])&surface.super_StandardSurface.super_Surface.m_impl) {
        operator_delete((void *)local_178);
      }
      iVar2 = iVar6 + 1;
    } while (iVar2 < argc);
  }
  rengine::SDLBackend::SDLBackend
            ((SDLBackend *)
             &surface.m_pendingJobs.
              super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
              ._M_impl._M_node._M_size);
  rengine::StandardSurface::StandardSurface((StandardSurface *)local_178);
  this = &surface.super_StandardSurface.m_workQueue.m_running;
  local_178 = (undefined1  [8])&PTR__BlendBenchWindow_00136858;
  surface.m_pendingJobs.
  super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  surface.super_StandardSurface.m_workQueue._120_8_ = this;
  surface.m_pendingJobs.
  super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  (**(code **)(*surface.super_StandardSurface.super_Surface._vptr_Surface + 0x18))();
  if ((char)backend.super_Backend._vptr_Backend != '\x01') {
    local_178 = (undefined1  [8])&PTR__BlendBenchWindow_00136858;
    std::__cxx11::
    _List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
    ::_M_clear((_List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
                *)this);
    rengine::StandardSurface::~StandardSurface((StandardSurface *)local_178);
    surface.m_pendingJobs.
    super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
    ._M_impl._M_node._M_size = (size_t)&PTR__SDLBackend_001365c0;
    SDL_Quit();
    return 0;
  }
  do {
    (**(code **)(surface.m_pendingJobs.
                 super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
                 ._M_impl._M_node._M_size + 0x10))
              (&surface.m_pendingJobs.
                super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
                ._M_impl._M_node._M_size);
  } while( true );
}

Assistant:

RENGINE_DEFINE_GLOBALS

int main(int argc, char **argv) {

    for (int i=0; i<argc; ++i) {
        std::string arg(argv[i]);
        if (i + 1 < argc && arg == "--count") {
            nodeCount = atoi(argv[++i]);
        } else if (arg == "--textures") {
            useTextures = true;
        } else if (arg == "-h" || arg == "--help") {
            cout << "Usage: " << endl
                 << " > " << argv[0] << " [options]" << endl
                 << endl
                 << "Options:" << endl
                 << "  --count [x]      Number of layers" << endl
                 << "  --textures       Use textures rather than solid fills" << endl;
        }
    }

    RENGINE_BACKEND backend;

    BlendBenchWindow surface;
    surface.show();

    backend.run();

    return 0;
}